

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

null_terminating_iterator<wchar_t>
fmt::v5::internal::
parse_arg_id<fmt::v5::internal::null_terminating_iterator<wchar_t>,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>&,wchar_t>>
          (null_terminating_iterator<wchar_t> it,
          id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
          *handler)

{
  basic_string_view<wchar_t> id;
  null_terminating_iterator<wchar_t> other;
  null_terminating_iterator<wchar_t> it_00;
  null_terminating_iterator<wchar_t> nVar1;
  bool bVar2;
  wchar_t wVar3;
  wchar_t *s;
  difference_type value;
  type count;
  id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
  *in_RDX;
  wchar_t *in_RSI;
  wchar_t *in_RDI;
  null_terminating_iterator<wchar_t> start;
  uint index;
  char_type c;
  char *in_stack_ffffffffffffff68;
  id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
  *in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 uVar4;
  wchar_t *pwVar5;
  id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
  *in_stack_ffffffffffffff98;
  null_terminating_iterator<wchar_t> *in_stack_ffffffffffffffa0;
  null_terminating_iterator<wchar_t> local_50;
  wchar_t *local_40;
  wchar_t *local_38;
  uint local_30;
  wchar_t local_2c;
  id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
  *local_28;
  null_terminating_iterator<wchar_t> local_20;
  wchar_t *local_10;
  wchar_t *local_8;
  
  local_28 = in_RDX;
  local_20.ptr_ = in_RDI;
  local_20.end_ = in_RSI;
  local_2c = null_terminating_iterator<wchar_t>::operator*(&local_20);
  if ((local_2c == L'}') || (local_2c == L':')) {
    id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
    ::operator()((id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
                  *)0x14f6cf);
    local_10 = local_20.ptr_;
    local_8 = local_20.end_;
  }
  else if ((local_2c < L'0') || (L'9' < local_2c)) {
    bVar2 = is_name_start<wchar_t>(local_2c);
    if (bVar2) {
      local_40 = local_20.ptr_;
      local_38 = local_20.end_;
      do {
        local_50 = null_terminating_iterator<wchar_t>::operator++(&local_20);
        local_2c = null_terminating_iterator<wchar_t>::operator*(&local_50);
        bVar2 = is_name_start<wchar_t>(local_2c);
        if (!bVar2) {
          in_stack_ffffffffffffff7e = L'/' < local_2c && local_2c < L':';
        }
        uVar4 = bVar2 || L'/' < local_2c && local_2c < L':';
      } while ((bool)uVar4);
      it_00.end_ = local_38;
      it_00.ptr_ = local_40;
      s = pointer_from<wchar_t>(it_00);
      other.end_ = local_38;
      other.ptr_ = local_40;
      pwVar5 = local_40;
      value = null_terminating_iterator<wchar_t>::operator-(&local_20,other);
      count = to_unsigned<long>(value);
      basic_string_view<wchar_t>::basic_string_view
                ((basic_string_view<wchar_t> *)&stack0xffffffffffffffa0,s,count);
      id.data_._6_1_ = in_stack_ffffffffffffff7e;
      id.data_._0_6_ = in_stack_ffffffffffffff78;
      id.data_._7_1_ = uVar4;
      id.size_ = (size_t)pwVar5;
      id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
      ::operator()(local_28,id);
      local_10 = local_20.ptr_;
      local_8 = local_20.end_;
    }
    else {
      id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
      ::on_error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      local_10 = local_20.ptr_;
      local_8 = local_20.end_;
    }
  }
  else {
    local_30 = parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<wchar_t>,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>&,wchar_t>&>
                         (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    wVar3 = null_terminating_iterator<wchar_t>::operator*(&local_20);
    if ((wVar3 == L'}') ||
       (wVar3 = null_terminating_iterator<wchar_t>::operator*(&local_20), wVar3 == L':')) {
      id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
      ::operator()(in_stack_ffffffffffffff70,(uint)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      local_10 = local_20.ptr_;
      local_8 = local_20.end_;
    }
    else {
      id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
      ::on_error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      local_10 = local_20.ptr_;
      local_8 = local_20.end_;
    }
  }
  nVar1.end_ = local_8;
  nVar1.ptr_ = local_10;
  return nVar1;
}

Assistant:

FMT_CONSTEXPR Iterator parse_arg_id(Iterator it, IDHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || c == ':') {
    handler();
    return it;
  }
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(it, handler);
    if (*it != '}' && *it != ':') {
      handler.on_error("invalid format string");
      return it;
    }
    handler(index);
    return it;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return it;
  }
  auto start = it;
  do {
    c = *++it;
  } while (is_name_start(c) || ('0' <= c && c <= '9'));
  handler(basic_string_view<char_type>(pointer_from(start), to_unsigned(it - start)));
  return it;
}